

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tadsrsc.c
# Opt level: O3

opdef * addop(opdef *cur,char *nam,opctxdef *opctx)

{
  int iVar1;
  ushort **ppuVar2;
  size_t sVar3;
  size_t sVar4;
  opdef *poVar5;
  char cVar6;
  char *pcVar7;
  char *result_buf;
  osdirhdl_t dirhdl;
  unsigned_long fmode_1;
  unsigned_long fmode;
  unsigned_long fattr_1;
  unsigned_long fattr;
  char dir_prefix [4096];
  char fname [4096];
  char resname [4096];
  char fullname [4096];
  osdirhdl_t local_5060;
  undefined8 local_5058;
  undefined8 local_5050;
  byte local_5048 [8];
  unsigned_long local_5040;
  char local_5038 [4096];
  char local_4038 [4096];
  char local_3038 [4096];
  char local_2038 [4096];
  char local_1038 [4104];
  
  if (opctx->doing_type != 0) {
    iVar1 = stricmp(nam,"xfcn");
    if (iVar1 == 0) {
      iVar1 = 1;
    }
    else {
      iVar1 = stricmp(nam,"html");
      if (iVar1 == 0) {
        iVar1 = 2;
      }
      else {
        iVar1 = 0;
        printf("invalid resource type specified: %s",nam);
        putchar(10);
        os_term(1);
      }
    }
    opctx->restype = iVar1;
    opctx->doing_type = 0;
    return cur;
  }
  cVar6 = *nam;
  if (cVar6 == '-') {
    iVar1 = stricmp(nam,"-type");
    if (iVar1 == 0) {
      opctx->doing_type = 1;
      return cur;
    }
    iVar1 = stricmp(nam,"-replace");
    if (iVar1 == 0) {
      opctx->flag = 3;
      return cur;
    }
    iVar1 = stricmp(nam,"-delete");
    if (iVar1 == 0) {
      opctx->flag = 2;
      return cur;
    }
    iVar1 = stricmp(nam,"-add");
    if (iVar1 != 0) {
      printf("invalid option: %s",nam);
      putchar(10);
      os_term(1);
      return cur;
    }
    opctx->flag = 1;
    return cur;
  }
  pcVar7 = nam + 1;
  while (cVar6 != '\0') {
    if (cVar6 == '=') {
      pcVar7[-1] = '\0';
      goto LAB_00106349;
    }
    cVar6 = *pcVar7;
    pcVar7 = pcVar7 + 1;
  }
  result_buf = local_2038;
  os_cvt_dir_url(result_buf,0x1000,nam);
  goto LAB_00106383;
  while( true ) {
    ppuVar2 = __ctype_b_loc();
    pcVar7 = result_buf + 1;
    if ((*(byte *)((long)*ppuVar2 + (long)cVar6 * 2 + 1) & 0x20) == 0) break;
LAB_00106349:
    result_buf = pcVar7;
    cVar6 = *result_buf;
    if ((long)cVar6 < 0) break;
  }
LAB_00106383:
  iVar1 = osfmode(nam,1,&local_5050,&local_5040);
  if ((iVar1 == 0) || ((local_5050._1_1_ & 0x40) == 0)) {
    sVar3 = strlen(result_buf);
    sVar4 = strlen(nam);
    poVar5 = (opdef *)malloc(sVar3 + sVar4 + 0x22);
    poVar5->opnxt = cur;
    poVar5->opflag = opctx->flag;
    poVar5->opres = (char *)(poVar5 + 1);
    iVar1 = get_file_restype(opctx->restype,nam);
    poVar5->oprestype = iVar1;
    strcpy(poVar5->opres,result_buf);
    pcVar7 = poVar5->opres;
    sVar3 = strlen(pcVar7);
    pcVar7 = pcVar7 + sVar3 + 1;
    poVar5->opfile = pcVar7;
    strcpy(pcVar7,nam);
    cur = poVar5;
  }
  else {
    os_cvt_dir_url(local_5038,0xfff,nam);
    if (local_5038[0] != '\0') {
      sVar3 = strlen(local_5038);
      (local_5038 + sVar3)[0] = '/';
      (local_5038 + sVar3)[1] = '\0';
    }
    iVar1 = os_open_dir(nam,&local_5060);
    if (iVar1 != 0) {
      iVar1 = os_read_dir(local_5060,local_3038,0x1000);
      if (iVar1 != 0) {
        poVar5 = cur;
        do {
          os_build_full_path(local_1038,0x1000,nam,local_3038);
          iVar1 = osfmode(local_1038,1,&local_5058,(unsigned_long *)local_5048);
          cur = poVar5;
          if (((iVar1 != 0) && ((local_5058._1_1_ & 0x40) == 0)) && ((local_5048[0] & 3) == 0)) {
            sprintf(local_4038,"%s%s",local_5038,local_3038);
            sVar3 = strlen(local_4038);
            sVar4 = strlen(local_1038);
            cur = (opdef *)malloc(sVar3 + sVar4 + 0x22);
            cur->opnxt = poVar5;
            cur->opflag = opctx->flag;
            iVar1 = get_file_restype(opctx->restype,local_3038);
            cur->oprestype = iVar1;
            poVar5 = cur + 1;
            cur->opres = (char *)poVar5;
            strcpy((char *)poVar5,local_4038);
            sVar3 = strlen((char *)poVar5);
            pcVar7 = (char *)((long)&cur[1].opnxt + sVar3 + 1);
            cur->opfile = pcVar7;
            strcpy(pcVar7,local_1038);
          }
          iVar1 = os_read_dir(local_5060,local_3038,0x1000);
          poVar5 = cur;
        } while (iVar1 != 0);
      }
      os_close_dir(local_5060);
    }
  }
  return cur;
}

Assistant:

static opdef *addop(opdef *cur, char *nam, opctxdef *opctx)
{
    char  *p;
    opdef *newop;
    char   resname[OSFNMAX];
    unsigned long fmode;
    unsigned long fattr;

    /* see if we're parsing a -type argument */
    if (opctx->doing_type)
    {
        /* 
         *   parse the type name, and store it as the type for following
         *   resources
         */
        opctx->restype = parse_res_type(nam);
        
        /* we're done parsing the -type argument */
        opctx->doing_type = FALSE;

        /* 
         *   we're done parsing this argument - we haven't added any
         *   operations, so return old list head 
         */
        return cur;
    }

    /* see if we have an option */
    if (*nam == '-')
    {
        /* see what we have */
        if (!stricmp(nam, "-type"))
        {
            /* 
             *   note that we're doing a type, so we parse it on the next
             *   argument 
             */
            opctx->doing_type = TRUE;
        }
        else if (!stricmp(nam, "-replace"))
        {
            /* set current flags to replace */
            opctx->flag = OPFADD | OPFDEL;
        }
        else if (!stricmp(nam, "-delete"))
        {
            /* set current flags to delete */
            opctx->flag = OPFDEL;
        }
        else if (!stricmp(nam, "-add"))
        {
            /* set current flags to add */
            opctx->flag = OPFADD;
        }
        else
        {
            /* invalid argument */
            rscptf("invalid option: %s", nam);
            errexit("", 1);
        }

        /* 
         *   done parsing this option - we didn't add a new operation, so
         *   return the current list head 
         */
        return cur;
    }

    /* look for '=' */
    for (p = nam ; *p && *p != '=' ; ++p);
    if (*p == '=')
    {
        /* 
         *   We found an '=', so an explicit resource name follows - use
         *   the given string as the resource name rather than basing the
         *   resource name on the filename.  First, overwrite the '=' with
         *   a null byte so that the filename string is terminated.  
         */
        *p = '\0';

        /* skip the '=' (now the null byte, of course) */
        ++p;

        /* 
         *   skip any spaces after the '='; leave p pointing to the start
         *   of the resource name 
         */
        while (t_isspace(*p))
            ++p;
    }
    else
    {
        /* 
         *   A resource name wasn't specified - synthesize a resource name
         *   based on the filename by converting from the local file system
         *   name to a relative URL 
         */
        os_cvt_dir_url(resname, sizeof(resname), nam);

        /* point p to the synthesized resource name */
        p = resname;
    }
    
    /*
     *   If we're adding a directory, rather than returning a single op
     *   for the directory, expand the directory into ops for for all of
     *   the files in the directory. 
     */
    if (osfmode(nam, TRUE, &fmode, &fattr)
        && (fmode & OSFMODE_DIR) != 0)
        return addopdir(cur, nam, opctx);
    
    /* allocate space and set up new op */
    newop = (opdef *)malloc(sizeof(opdef) + strlen(p) + strlen(nam) + 2);

    newop->opnxt  = cur;
    newop->opflag = opctx->flag;
    newop->opres  = (char *)(newop + 1);
    newop->oprestype = get_file_restype(opctx->restype, nam);
    strcpy(newop->opres, p);
    newop->opfile = newop->opres + strlen(newop->opres) + 1;
    strcpy(newop->opfile, nam);

    return(newop);
}